

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O2

IXML_NodeList *
ixmlElement_getElementsByTagNameNS(IXML_Element *element,char *namespaceURI,char *localName)

{
  IXML_NodeList *nodeList;
  IXML_NodeList *local_10;
  
  local_10 = (IXML_NodeList *)0x0;
  if (localName == (char *)0x0 || (namespaceURI == (char *)0x0 || element == (IXML_Element *)0x0)) {
    local_10 = (IXML_NodeList *)0x0;
  }
  else {
    ixmlNode_getElementsByTagNameNS(&element->n,namespaceURI,localName,&local_10);
  }
  return local_10;
}

Assistant:

IXML_NodeList *ixmlElement_getElementsByTagNameNS(IXML_Element *element,
	const DOMString namespaceURI,
	const DOMString localName)
{
	IXML_Node *node = (IXML_Node *)element;
	IXML_NodeList *nodeList = NULL;

	if (element != NULL && namespaceURI != NULL && localName != NULL) {
		ixmlNode_getElementsByTagNameNS(
			node, namespaceURI, localName, &nodeList);
	}

	return nodeList;
}